

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLinkedTree.h
# Opt level: O2

PointerType __thiscall cmLinkedTree<cmDefinitions>::iterator::operator->(iterator *this)

{
  cmLinkedTree<cmDefinitions> *pcVar1;
  pointer pcVar2;
  ulong uVar3;
  uint __line;
  ulong uVar4;
  char *__assertion;
  
  pcVar1 = this->Tree;
  if (pcVar1 == (cmLinkedTree<cmDefinitions> *)0x0) {
    __assertion = "this->Tree";
    __line = 0x4d;
  }
  else {
    uVar4 = (long)(pcVar1->UpPositions).
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)(pcVar1->UpPositions).
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start >> 3;
    pcVar2 = (pcVar1->Data).super__Vector_base<cmDefinitions,_std::allocator<cmDefinitions>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if (uVar4 == ((long)(pcVar1->Data).
                        super__Vector_base<cmDefinitions,_std::allocator<cmDefinitions>_>._M_impl.
                        super__Vector_impl_data._M_finish - (long)pcVar2) / 0x38) {
      uVar3 = this->Position;
      if (uVar4 < uVar3) {
        __assertion = "this->Position <= this->Tree->Data.size()";
        __line = 0x4f;
      }
      else {
        if (uVar3 != 0) {
          return pcVar2 + uVar3 + 0xffffffffffffffff;
        }
        __assertion = "this->Position > 0";
        __line = 0x50;
      }
    }
    else {
      __assertion = "this->Tree->UpPositions.size() == this->Tree->Data.size()";
      __line = 0x4e;
    }
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmLinkedTree.h"
                ,__line,
                "PointerType cmLinkedTree<cmDefinitions>::iterator::operator->() [T = cmDefinitions]"
               );
}

Assistant:

PointerType operator->()
    {
      assert(this->Tree);
      assert(this->Tree->UpPositions.size() == this->Tree->Data.size());
      assert(this->Position <= this->Tree->Data.size());
      assert(this->Position > 0);
      return this->Tree->GetPointer(this->Position - 1);
    }